

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O0

Clause * Inferences::replaceLit(Clause *c,Literal *a,Literal *b,Inference *inf)

{
  bool bVar1;
  Clause *pCVar2;
  undefined8 *in_RCX;
  Literal *lit;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  RStack<Literal_*> resLits;
  StlIter *in_stack_ffffffffffffff18;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff20;
  Clause *in_stack_ffffffffffffff30;
  undefined8 local_b8;
  undefined8 uStack_b0;
  SplitSet *local_a8;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this;
  Inference *in_stack_ffffffffffffff88;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff90;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined8 *local_20;
  
  local_20 = in_RCX;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_ffffffffffffff20);
  Kernel::Clause::iterLits(in_stack_ffffffffffffff30);
  local_38 = local_50;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_ffffffffffffff18);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_ffffffffffffff18);
  while (bVar1 = Lib::operator!=((StlIter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18),
        bVar1) {
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator*((StlIter *)0x838771);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x838792);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_ffffffffffffff20,(Literal *)in_stack_ffffffffffffff18);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_ffffffffffffff20);
  }
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            0x83880b);
  local_b8 = *local_20;
  uStack_b0 = local_20[1];
  local_a8 = (SplitSet *)local_20[2];
  this = (Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
         local_20[3];
  pCVar2 = Kernel::Clause::fromStack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff48);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(this);
  return pCVar2;
}

Assistant:

Clause* replaceLit(Clause *c, Literal *a, Literal *b, const Inference& inf)
  {
    RStack<Literal*> resLits;
    for (auto lit : c->iterLits()) {
      resLits->push(lit == a ? b : lit);
    }
    return Clause::fromStack(*resLits,inf);
  }